

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::LSTM_x86_avx512::forward
          (LSTM_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  int i;
  pointer pMVar8;
  void *in_R8;
  void *__src;
  int iVar9;
  void *__dest;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar10;
  bool bVar11;
  Mat m;
  Mat local_378;
  Mat local_328;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_2d8;
  ulong local_2d0;
  Mat m_3;
  Mat m_6;
  Mat m_2;
  Mat m_1;
  Mat m_5;
  Mat m_4;
  Mat local_110;
  Mat m_9;
  Mat m_8;
  
  if ((this->super_LSTM).int8_scale_term != 0) {
    iVar2 = forward_int8(this,bottom_blobs,top_blobs,opt);
    return iVar2;
  }
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  local_2d0 = (ulong)(uint)bottom_blob->h;
  iVar2 = (this->super_LSTM).direction;
  local_328.cstep = 0;
  local_328.data = (void *)0x0;
  local_328.refcount._0_4_ = 0;
  local_328.refcount._4_4_ = 0;
  local_328.elemsize._0_4_ = 0;
  local_328.elemsize._4_4_ = 0;
  local_328.elempack = 0;
  local_328.allocator = (Allocator *)0x0;
  local_328.dims = 0;
  local_328.w = 0;
  local_328.h = 0;
  local_328.d = 0;
  local_328.c = 0;
  local_378.cstep = 0;
  local_378.data = (void *)0x0;
  local_378.refcount._0_4_ = 0;
  local_378.refcount._4_4_ = 0;
  local_378.elemsize._0_4_ = 0;
  local_378.elemsize._4_4_ = 0;
  local_378.elempack = 0;
  local_378.allocator = (Allocator *)0x0;
  local_378.dims = 0;
  local_378.w = 0;
  local_378.h = 0;
  local_378.d = 0;
  local_378.c = 0;
  _allocator = (&opt->blob_allocator)
               [(long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_finish -
                (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start != 0xd8];
  local_2d8 = top_blobs;
  if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)bottom_blob == 0xd8) {
    Mat::clone(&m,(__fn *)(bottom_blob + 1),_allocator,0xd8,in_R8);
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    iVar9 = (int)local_2d0;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_328.allocator == (Allocator *)0x0) {
          if (local_328.data != (void *)0x0) {
            free(local_328.data);
          }
        }
        else {
          (*(local_328.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_328.data = m.data;
    local_328.refcount._0_4_ = m.refcount._0_4_;
    local_328.refcount._4_4_ = m.refcount._4_4_;
    local_328.elemsize._0_4_ = (undefined4)m.elemsize;
    local_328.elemsize._4_4_ = m.elemsize._4_4_;
    local_328.elempack = m.elempack;
    local_328.allocator = m.allocator;
    local_328.dims = m.dims;
    local_328.w = m.w;
    local_328.h = m.h;
    local_328.d = m.d;
    local_328.c = m.c;
    local_328.cstep = m.cstep;
    sVar5 = m.cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    Mat::clone(&m,(__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_start + 2),_allocator,(int)sVar5,
               in_R8);
    pvVar10 = local_2d8;
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    piVar1 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_378.allocator == (Allocator *)0x0) {
          if (local_378.data != (void *)0x0) {
            free(local_378.data);
          }
        }
        else {
          (*(local_378.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    local_378.data = m.data;
    local_378.refcount._0_4_ = m.refcount._0_4_;
    local_378.refcount._4_4_ = m.refcount._4_4_;
    local_378.elemsize._0_4_ = (undefined4)m.elemsize;
    local_378.elemsize._4_4_ = m.elemsize._4_4_;
    local_378.elempack = m.elempack;
    local_378.allocator = m.allocator;
    local_378.dims = m.dims;
    local_378.w = m.w;
    local_378.h = m.h;
    local_378.d = m.d;
    local_378.c = m.c;
    local_378.cstep = m.cstep;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    iVar9 = (iVar2 == 2) + 1;
    Mat::create(&local_328,(this->super_LSTM).num_output,iVar9,4,_allocator);
    iVar4 = -100;
    if ((local_328.data == (void *)0x0) || (local_328.cstep * (long)local_328.c == 0))
    goto LAB_00367ade;
    uVar3 = (int)local_328.cstep * local_328.c;
    if (0 < (int)uVar3) {
      memset(local_328.data,0,(ulong)uVar3 << 2);
    }
    Mat::create(&local_378,(this->super_LSTM).hidden_size,iVar9,4,_allocator);
    pvVar10 = local_2d8;
    if ((local_378.data == (void *)0x0) ||
       (iVar9 = (int)local_2d0, local_378.cstep * (long)local_378.c == 0)) goto LAB_00367ade;
    uVar3 = (int)local_378.cstep * local_378.c;
    if (0 < (int)uVar3) {
      memset(local_378.data,0,(ulong)uVar3 << 2);
    }
  }
  this_00 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,(this->super_LSTM).num_output << (iVar2 == 2),iVar9,4,opt->blob_allocator);
  iVar4 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    uVar3 = (this->super_LSTM).direction;
    if (uVar3 < 2) {
      m.w = (this->weight_xc_data_packed).w;
      m.h = (this->weight_xc_data_packed).h;
      m.c = (this->weight_xc_data_packed).d;
      m.data = (this->weight_xc_data_packed).data;
      uVar6 = (this->weight_xc_data_packed).elemsize;
      m.elempack = (this->weight_xc_data_packed).elempack;
      m.allocator = (this->weight_xc_data_packed).allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = (undefined4)uVar6;
      m.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m.d = 1;
      iVar2 = (this->weight_xc_data_packed).dims;
      m.dims = iVar2 + -1;
      m.cstep = (uVar6 * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar2 == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = (this->bias_c_data_packed).w;
      m_1.h = (this->bias_c_data_packed).h;
      m_1.data = (this->bias_c_data_packed).data;
      uVar6 = (this->bias_c_data_packed).elemsize;
      m_1.elempack = (this->bias_c_data_packed).elempack;
      m_1.allocator = (this->bias_c_data_packed).allocator;
      m_1.refcount._0_4_ = 0;
      m_1.refcount._4_4_ = 0;
      m_1.elemsize._0_4_ = (undefined4)uVar6;
      m_1.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
      m_1.c = (this->bias_c_data_packed).d;
      m_1.d = 1;
      iVar2 = (this->bias_c_data_packed).dims;
      m_1.dims = iVar2 + -1;
      m_1.cstep = (uVar6 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar6;
      if (iVar2 == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      m_2.w = (this->weight_hc_data_packed).w;
      m_2.h = (this->weight_hc_data_packed).h;
      m_2.c = (this->weight_hc_data_packed).d;
      m_2.data = (this->weight_hc_data_packed).data;
      m_2.elemsize = (this->weight_hc_data_packed).elemsize;
      m_2.elempack = (this->weight_hc_data_packed).elempack;
      m_2.allocator = (this->weight_hc_data_packed).allocator;
      m_2.refcount = (int *)0x0;
      m_2.d = 1;
      sVar5 = (long)m_2.h * (long)m_2.w;
      iVar2 = (this->weight_hc_data_packed).dims;
      m_2.dims = iVar2 + -1;
      m_2.cstep = (m_2.elemsize * sVar5 + 0xf & 0xfffffffffffffff0) / m_2.elemsize;
      if (iVar2 == 4) {
        m_2.cstep = sVar5;
      }
      if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
        m_3.cstep = 0;
        m_3.data = (void *)0x0;
        m_3.elemsize._0_4_ = 0;
        m_3.elemsize._4_4_ = 0;
        m_3.elempack = 0;
        m_3.allocator = (Allocator *)0x0;
        m_3.dims = 0;
        m_3.w = 0;
        m_3.h = 0;
        m_3.d = 0;
        m_3.c = 0;
      }
      else {
        m_3.w = (this->super_LSTM).weight_hr_data.w;
        m_3.h = (this->super_LSTM).weight_hr_data.h;
        m_3.c = (this->super_LSTM).weight_hr_data.d;
        m_3.data = (this->super_LSTM).weight_hr_data.data;
        uVar6 = (this->super_LSTM).weight_hr_data.elemsize;
        m_3.elempack = (this->super_LSTM).weight_hr_data.elempack;
        m_3.allocator = (this->super_LSTM).weight_hr_data.allocator;
        m_3.elemsize._0_4_ = (undefined4)uVar6;
        m_3.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
        m_3.d = 1;
        iVar2 = (this->super_LSTM).weight_hr_data.dims;
        m_3.dims = iVar2 + -1;
        m_3.cstep = (uVar6 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar6;
        if (iVar2 == 4) {
          m_3.cstep = (long)m_3.h * (long)m_3.w;
        }
      }
      m_3.refcount._4_4_ = 0;
      m_3.refcount._0_4_ = 0;
      iVar4 = lstm(bottom_blob,this_00,uVar3,&m,&m_1,&m_2,&m_3,&local_328,&local_378,opt);
      if (iVar4 != 0) goto LAB_00367ade;
      uVar3 = (this->super_LSTM).direction;
    }
    if (uVar3 == 2) {
      m.cstep = 0;
      m.data = (void *)0x0;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.elemsize._0_4_ = 0;
      m.elemsize._4_4_ = 0;
      m.elempack = 0;
      m.allocator = (Allocator *)0x0;
      m.dims = 0;
      m.w = 0;
      m.h = 0;
      m.d = 0;
      m.c = 0;
      Mat::create(&m,(this->super_LSTM).num_output,iVar9,4,opt->workspace_allocator);
      iVar4 = -100;
      if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
        bVar11 = false;
      }
      else {
        m_1.cstep = 0;
        m_1.data = (void *)0x0;
        m_1.refcount._0_4_ = 0;
        m_1.refcount._4_4_ = 0;
        m_1.elemsize._0_4_ = 0;
        m_1.elemsize._4_4_ = 0;
        m_1.elempack = 0;
        m_1.allocator = (Allocator *)0x0;
        m_1.dims = 0;
        m_1.w = 0;
        m_1.h = 0;
        m_1.d = 0;
        m_1.c = 0;
        Mat::create(&m_1,(this->super_LSTM).num_output,iVar9,4,opt->workspace_allocator);
        iVar4 = -100;
        if ((m_1.data == (void *)0x0) || ((long)m_1.c * m_1.cstep == 0)) {
          bVar11 = false;
        }
        else {
          m_2.cstep = (size_t)local_328.w;
          m_2.elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
          m_2.data = local_328.data;
          m_2.refcount = (int *)0x0;
          m_2.elempack = local_328.elempack;
          m_2.allocator = local_328.allocator;
          m_2.dims = 2;
          m_2.w = local_328.w;
          m_2.h = 1;
          m_2.d = 1;
          m_2.c = 1;
          m_3.cstep = (size_t)local_378.w;
          m_3.data = local_378.data;
          m_3.refcount._0_4_ = 0;
          m_3.refcount._4_4_ = 0;
          m_3.elemsize._0_4_ = (undefined4)local_378.elemsize;
          m_3.elemsize._4_4_ = local_378.elemsize._4_4_;
          m_3.elempack = local_378.elempack;
          m_3.allocator = local_378.allocator;
          m_3.dims = 2;
          m_3.w = local_378.w;
          m_3.h = 1;
          m_3.d = 1;
          m_3.c = 1;
          local_110.w = (this->weight_xc_data_packed).w;
          local_110.h = (this->weight_xc_data_packed).h;
          local_110.c = (this->weight_xc_data_packed).d;
          local_110.data = (this->weight_xc_data_packed).data;
          local_110.elemsize = (this->weight_xc_data_packed).elemsize;
          local_110.elempack = (this->weight_xc_data_packed).elempack;
          local_110.allocator = (this->weight_xc_data_packed).allocator;
          local_110.refcount = (int *)0x0;
          local_110.d = 1;
          uVar6 = (long)local_110.h * (long)local_110.w;
          iVar2 = (this->weight_xc_data_packed).dims;
          local_110.dims = iVar2 + -1;
          local_110.cstep =
               (local_110.elemsize * uVar6 + 0xf & 0xfffffffffffffff0) / local_110.elemsize;
          if (iVar2 == 4) {
            local_110.cstep = uVar6;
          }
          m_4.w = (this->bias_c_data_packed).w;
          m_4.h = (this->bias_c_data_packed).h;
          m_4.c = (this->bias_c_data_packed).d;
          m_4.data = (this->bias_c_data_packed).data;
          m_4.elemsize = (this->bias_c_data_packed).elemsize;
          m_4.elempack = (this->bias_c_data_packed).elempack;
          m_4.allocator = (this->bias_c_data_packed).allocator;
          m_4.refcount = (int *)0x0;
          m_4.d = 1;
          sVar5 = (long)m_4.h * (long)m_4.w;
          iVar2 = (this->bias_c_data_packed).dims;
          m_4.dims = iVar2 + -1;
          m_4.cstep = (m_4.elemsize * sVar5 + 0xf & 0xfffffffffffffff0) / m_4.elemsize;
          if (iVar2 == 4) {
            m_4.cstep = sVar5;
          }
          m_5.w = (this->weight_hc_data_packed).w;
          m_5.h = (this->weight_hc_data_packed).h;
          m_5.c = (this->weight_hc_data_packed).d;
          m_5.data = (this->weight_hc_data_packed).data;
          m_5.elemsize = (this->weight_hc_data_packed).elemsize;
          m_5.elempack = (this->weight_hc_data_packed).elempack;
          m_5.allocator = (this->weight_hc_data_packed).allocator;
          m_5.refcount = (int *)0x0;
          m_5.d = 1;
          iVar2 = (this->weight_hc_data_packed).dims;
          m_5.dims = iVar2 + -1;
          m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                      m_5.elemsize;
          if (iVar2 == 4) {
            m_5.cstep = (long)m_5.h * (long)m_5.w;
          }
          if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
            m_6.cstep = 0;
            m_6.data = (void *)0x0;
            m_6.elemsize._0_4_ = 0;
            m_6.elemsize._4_4_ = 0;
            m_6.elempack = 0;
            m_6.allocator = (Allocator *)0x0;
            m_6.dims = 0;
            m_6.w = 0;
            m_6.h = 0;
            m_6.d = 0;
            m_6.c = 0;
          }
          else {
            m_6.w = (this->super_LSTM).weight_hr_data.w;
            m_6.h = (this->super_LSTM).weight_hr_data.h;
            m_6.data = (this->super_LSTM).weight_hr_data.data;
            uVar6 = (this->super_LSTM).weight_hr_data.elemsize;
            m_6.elempack = (this->super_LSTM).weight_hr_data.elempack;
            m_6.allocator = (this->super_LSTM).weight_hr_data.allocator;
            m_6.elemsize._0_4_ = (undefined4)uVar6;
            m_6.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_6.c = (this->super_LSTM).weight_hr_data.d;
            m_6.d = 1;
            iVar2 = (this->super_LSTM).weight_hr_data.dims;
            m_6.dims = iVar2 + -1;
            m_6.cstep = (uVar6 * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar2 == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
          }
          m_6.refcount._4_4_ = 0;
          m_6.refcount._0_4_ = 0;
          iVar4 = lstm(bottom_blob,&m,0,&local_110,&m_4,&m_5,&m_6,&m_2,&m_3,opt);
          if (iVar4 == 0) {
            local_110.cstep = (size_t)local_328.w;
            local_110.elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
            local_110.data = (void *)(local_110.elemsize * local_110.cstep + (long)local_328.data);
            local_110.refcount = (int *)0x0;
            local_110.elempack = local_328.elempack;
            local_110.allocator = local_328.allocator;
            local_110.dims = 2;
            local_110.w = local_328.w;
            local_110.h = 1;
            local_110.d = 1;
            local_110.c = 1;
            m_4.cstep = (size_t)local_378.w;
            m_4.elemsize = CONCAT44(local_378.elemsize._4_4_,(undefined4)local_378.elemsize);
            m_4.data = (void *)(m_4.elemsize * m_4.cstep + (long)local_378.data);
            m_4.refcount = (int *)0x0;
            m_4.elempack = local_378.elempack;
            m_4.allocator = local_378.allocator;
            m_4.dims = 2;
            m_4.w = local_378.w;
            m_4.h = 1;
            m_4.d = 1;
            m_4.c = 1;
            m_5.w = (this->weight_xc_data_packed).w;
            m_5.h = (this->weight_xc_data_packed).h;
            m_5.c = (this->weight_xc_data_packed).d;
            m_5.elemsize = (this->weight_xc_data_packed).elemsize;
            m_5.data = (void *)((this->weight_xc_data_packed).cstep * m_5.elemsize +
                               (long)(this->weight_xc_data_packed).data);
            m_5.elempack = (this->weight_xc_data_packed).elempack;
            m_5.allocator = (this->weight_xc_data_packed).allocator;
            m_5.refcount = (int *)0x0;
            m_5.d = 1;
            iVar2 = (this->weight_xc_data_packed).dims;
            m_5.dims = iVar2 + -1;
            m_5.cstep = (m_5.elemsize * (long)m_5.h * (long)m_5.w + 0xf & 0xfffffffffffffff0) /
                        m_5.elemsize;
            if (iVar2 == 4) {
              m_5.cstep = (long)m_5.h * (long)m_5.w;
            }
            m_6.w = (this->bias_c_data_packed).w;
            m_6.h = (this->bias_c_data_packed).h;
            uVar6 = (this->bias_c_data_packed).elemsize;
            m_6.data = (void *)((this->bias_c_data_packed).cstep * uVar6 +
                               (long)(this->bias_c_data_packed).data);
            m_6.elempack = (this->bias_c_data_packed).elempack;
            m_6.allocator = (this->bias_c_data_packed).allocator;
            m_6.refcount._0_4_ = 0;
            m_6.refcount._4_4_ = 0;
            m_6.elemsize._0_4_ = (undefined4)uVar6;
            m_6.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
            m_6.c = (this->bias_c_data_packed).d;
            m_6.d = 1;
            iVar2 = (this->bias_c_data_packed).dims;
            m_6.dims = iVar2 + -1;
            m_6.cstep = (uVar6 * (long)m_6.h * (long)m_6.w + 0xf & 0xfffffffffffffff0) / uVar6;
            if (iVar2 == 4) {
              m_6.cstep = (long)m_6.h * (long)m_6.w;
            }
            m_8.w = (this->weight_hc_data_packed).w;
            m_8.h = (this->weight_hc_data_packed).h;
            m_8.c = (this->weight_hc_data_packed).d;
            m_8.elemsize = (this->weight_hc_data_packed).elemsize;
            m_8.data = (void *)((this->weight_hc_data_packed).cstep * m_8.elemsize +
                               (long)(this->weight_hc_data_packed).data);
            m_8.elempack = (this->weight_hc_data_packed).elempack;
            m_8.allocator = (this->weight_hc_data_packed).allocator;
            m_8.refcount = (int *)0x0;
            m_8.d = 1;
            iVar2 = (this->weight_hc_data_packed).dims;
            m_8.dims = iVar2 + -1;
            m_8.cstep = (m_8.elemsize * (long)m_8.h * (long)m_8.w + 0xf & 0xfffffffffffffff0) /
                        m_8.elemsize;
            if (iVar2 == 4) {
              m_8.cstep = (long)m_8.h * (long)m_8.w;
            }
            if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
              m_9.cstep = 0;
              m_9.data = (void *)0x0;
              m_9.elemsize._0_4_ = 0;
              m_9.elemsize._4_4_ = 0;
              m_9.elempack = 0;
              m_9.allocator = (Allocator *)0x0;
              m_9.dims = 0;
              m_9.w = 0;
              m_9.h = 0;
              m_9.d = 0;
              m_9.c = 0;
            }
            else {
              m_9.w = (this->super_LSTM).weight_hr_data.w;
              m_9.h = (this->super_LSTM).weight_hr_data.h;
              uVar6 = (this->super_LSTM).weight_hr_data.elemsize;
              m_9.data = (void *)((this->super_LSTM).weight_hr_data.cstep * uVar6 +
                                 (long)(this->super_LSTM).weight_hr_data.data);
              m_9.elempack = (this->super_LSTM).weight_hr_data.elempack;
              m_9.allocator = (this->super_LSTM).weight_hr_data.allocator;
              m_9.elemsize._0_4_ = (undefined4)uVar6;
              m_9.elemsize._4_4_ = (undefined4)(uVar6 >> 0x20);
              m_9.c = (this->super_LSTM).weight_hr_data.d;
              m_9.d = 1;
              iVar2 = (this->super_LSTM).weight_hr_data.dims;
              m_9.dims = iVar2 + -1;
              m_9.cstep = (uVar6 * (long)m_9.h * (long)m_9.w + 0xf & 0xfffffffffffffff0) / uVar6;
              if (iVar2 == 4) {
                m_9.cstep = (long)m_9.h * (long)m_9.w;
              }
            }
            m_9.refcount._4_4_ = 0;
            m_9.refcount._0_4_ = 0;
            iVar4 = lstm(bottom_blob,&m_1,1,&m_5,&m_6,&m_8,&m_9,&local_110,&m_4,opt);
            bVar11 = iVar4 == 0;
            if (0 < iVar9 && bVar11) {
              uVar6 = 0;
              do {
                __src = (void *)((long)m_1.w * uVar6 *
                                 CONCAT44(m_1.elemsize._4_4_,(undefined4)m_1.elemsize) +
                                (long)m_1.data);
                __dest = (void *)((long)this_00->w * uVar6 * this_00->elemsize + (long)this_00->data
                                 );
                memcpy(__dest,(void *)((long)m.w * uVar6 *
                                       CONCAT44(m.elemsize._4_4_,(undefined4)m.elemsize) +
                                      (long)m.data),(long)(this->super_LSTM).num_output << 2);
                lVar7 = (long)(this->super_LSTM).num_output;
                memcpy((void *)(lVar7 * 4 + (long)__dest),__src,lVar7 << 2);
                uVar6 = uVar6 + 1;
              } while (local_2d0 != uVar6);
            }
            piVar1 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                if (m_3.allocator == (Allocator *)0x0) {
                  if (m_3.data != (void *)0x0) {
                    free(m_3.data);
                  }
                }
                else {
                  (*(m_3.allocator)->_vptr_Allocator[3])();
                }
              }
            }
          }
          else {
            bVar11 = false;
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                if (m_2.data != (void *)0x0) {
                  free(m_2.data);
                }
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        piVar1 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      piVar1 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          if (m.allocator == (Allocator *)0x0) {
            if (m.data != (void *)0x0) {
              free(m.data);
            }
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (!bVar11) goto LAB_00367ade;
    }
    pMVar8 = (local_2d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = 0;
    if ((long)(local_2d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar8 == 0xd8) {
      if (pMVar8 + 1 != &local_328) {
        piVar1 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = pMVar8[1].refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (pMVar8[1].allocator == (Allocator *)0x0) {
              if (pMVar8[1].data != (void *)0x0) {
                free(pMVar8[1].data);
              }
            }
            else {
              (*(pMVar8[1].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar8[1].data = local_328.data;
        pMVar8[1].refcount = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
        pMVar8[1].elemsize = CONCAT44(local_328.elemsize._4_4_,(undefined4)local_328.elemsize);
        pMVar8[1].elempack = local_328.elempack;
        pMVar8[1].allocator = local_328.allocator;
        pMVar8[1].dims = local_328.dims;
        pMVar8[1].w = local_328.w;
        pMVar8[1].h = local_328.h;
        pMVar8[1].d = local_328.d;
        pMVar8[1].c = local_328.c;
        pMVar8[1].cstep = local_328.cstep;
        pMVar8 = (local_2d8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      iVar4 = 0;
      if (pMVar8 + 2 != &local_378) {
        piVar1 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + 1;
          UNLOCK();
        }
        piVar1 = pMVar8[2].refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (pMVar8[2].allocator == (Allocator *)0x0) {
              if (pMVar8[2].data != (void *)0x0) {
                free(pMVar8[2].data);
              }
            }
            else {
              (*(pMVar8[2].allocator)->_vptr_Allocator[3])();
            }
          }
        }
        pMVar8[2].data = local_378.data;
        pMVar8[2].refcount = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
        pMVar8[2].elemsize = CONCAT44(local_378.elemsize._4_4_,(undefined4)local_378.elemsize);
        pMVar8[2].elempack = local_378.elempack;
        pMVar8[2].allocator = local_378.allocator;
        pMVar8[2].dims = local_378.dims;
        pMVar8[2].w = local_378.w;
        pMVar8[2].h = local_378.h;
        pMVar8[2].d = local_378.d;
        pMVar8[2].c = local_378.c;
        pMVar8[2].cstep = local_378.cstep;
      }
    }
  }
LAB_00367ade:
  piVar1 = (int *)CONCAT44(local_378.refcount._4_4_,local_378.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_378.allocator == (Allocator *)0x0) {
        if (local_378.data != (void *)0x0) {
          free(local_378.data);
        }
      }
      else {
        (*(local_378.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar1 = (int *)CONCAT44(local_328.refcount._4_4_,local_328.refcount._0_4_);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_328.allocator == (Allocator *)0x0) {
        if (local_328.data != (void *)0x0) {
          free(local_328.data);
        }
      }
      else {
        (*(local_328.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar4;
}

Assistant:

int LSTM_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return forward_int8(bottom_blobs, top_blobs, opt);
    }
#endif

    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(hidden_size, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        {
            int ret = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data_packed.channel(0), bias_c_data_packed.channel(0), weight_hc_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden0, cell0, opt);
            if (ret != 0)
                return ret;
        }

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        {
            int ret = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data_packed.channel(1), bias_c_data_packed.channel(1), weight_hc_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden1, cell1, opt);
            if (ret != 0)
                return ret;
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}